

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3OpenTokenizer
              (sqlite3_tokenizer *pTokenizer,int iLangid,char *z,int n,
              sqlite3_tokenizer_cursor **ppCsr)

{
  sqlite3_tokenizer_module *psVar1;
  int iVar2;
  int iVar3;
  sqlite3_tokenizer_cursor *local_38;
  
  psVar1 = pTokenizer->pModule;
  local_38 = (sqlite3_tokenizer_cursor *)0x0;
  iVar2 = (*psVar1->xOpen)(pTokenizer,z,n,&local_38);
  if (iVar2 == 0) {
    local_38->pTokenizer = pTokenizer;
    iVar2 = 0;
    if ((0 < psVar1->iVersion) && (iVar3 = (*psVar1->xLanguageid)(local_38,iLangid), iVar3 != 0)) {
      (*psVar1->xClose)(local_38);
      local_38 = (sqlite3_tokenizer_cursor *)0x0;
      iVar2 = iVar3;
    }
  }
  *ppCsr = local_38;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3OpenTokenizer(
  sqlite3_tokenizer *pTokenizer,
  int iLangid,
  const char *z,
  int n,
  sqlite3_tokenizer_cursor **ppCsr
){
  sqlite3_tokenizer_module const *pModule = pTokenizer->pModule;
  sqlite3_tokenizer_cursor *pCsr = 0;
  int rc;

  rc = pModule->xOpen(pTokenizer, z, n, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( rc==SQLITE_OK ){
    pCsr->pTokenizer = pTokenizer;
    if( pModule->iVersion>=1 ){
      rc = pModule->xLanguageid(pCsr, iLangid);
      if( rc!=SQLITE_OK ){
        pModule->xClose(pCsr);
        pCsr = 0;
      }
    }
  }
  *ppCsr = pCsr;
  return rc;
}